

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O0

bool __thiscall cmParsePHPCoverage::ReadInt(cmParsePHPCoverage *this,istream *in,int *v)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  char *__nptr;
  string local_40 [7];
  char c;
  string s;
  int *v_local;
  istream *in_local;
  cmParsePHPCoverage *this_local;
  
  s.field_2._8_8_ = v;
  std::__cxx11::string::string(local_40);
  while( true ) {
    plVar3 = (long *)std::istream::get((char *)in);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::string::operator+=(local_40,'\0');
  }
  __nptr = (char *)std::__cxx11::string::c_str();
  iVar2 = atoi(__nptr);
  *(int *)s.field_2._8_8_ = iVar2;
  std::__cxx11::string::~string(local_40);
  return true;
}

Assistant:

bool cmParsePHPCoverage::ReadInt(std::istream& in, int& v)
{
  std::string s;
  char c = 0;
  while (in.get(c) && c != ':' && c != ';') {
    s += c;
  }
  v = atoi(s.c_str());
  return true;
}